

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticSynapse.cpp
# Opt level: O3

void __thiscall StaticSynapse::update(StaticSynapse *this)

{
  long lVar1;
  Population *pPVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  iVar4 = this->outputSize;
  if (0 < iVar4) {
    uVar3 = (ulong)(uint)this->inputSize;
    lVar7 = 0;
    uVar6 = 0;
    do {
      if (0 < (int)uVar3) {
        lVar5 = 0;
        do {
          lVar1 = (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows;
          if ((lVar1 <= lVar5) ||
             ((this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols <= (long)uVar6)) {
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/DenseCoeffsBase.h"
                          ,0x16d,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                         );
          }
          (**(((this->super_Synapse).from_population)->output).
             super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar5]->_vptr_Event)
                    (*(undefined8 *)
                      ((long)(this->weights).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_data + lVar5 * 8 + lVar1 * lVar7));
          pPVar2 = (this->super_Synapse).to_population;
          (*pPVar2->_vptr_Population[5])
                    (pPVar2,uVar6 & 0xffffffff,
                     (((this->super_Synapse).from_population)->output).
                     super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar5]);
          lVar5 = lVar5 + 1;
          uVar3 = (ulong)this->inputSize;
        } while (lVar5 < (long)uVar3);
        iVar4 = this->outputSize;
      }
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 8;
    } while ((long)uVar6 < (long)iVar4);
  }
  return;
}

Assistant:

void StaticSynapse::update() {
    for(int i = 0; i < outputSize; i++) {
        for(int j = 0; j < inputSize; j++) {
            from_population->output[j]->setWeight(weights(j, i));
            to_population->setInput(i, from_population->output[j]);
        }
    }
}